

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseInternalSubset(xmlParserCtxtPtr ctxt)

{
  xmlChar xVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlEntityPtr pxVar4;
  xmlParserInputPtr pxVar5;
  
  if (*ctxt->input->cur == '[') {
    iVar2 = ctxt->inputNr;
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
LAB_0013d70b:
    pxVar3 = ctxt->input->cur;
    xVar1 = *pxVar3;
    if (((xVar1 == ']') && (ctxt->inputNr <= iVar2)) || (1 < ctxt->disableSAX)) goto LAB_0013d805;
    if (ctxt->inSubset == 2) {
      if (xVar1 == '%') goto LAB_0013d79a;
      if (xVar1 != '<') goto LAB_0013d7ec;
LAB_0013d75d:
      if ((pxVar3[1] != '!') || (pxVar3[2] != '[')) goto LAB_0013d773;
      xmlParseConditionalSections(ctxt);
    }
    else {
      pxVar4 = ctxt->input->entity;
      if (((pxVar4 != (xmlEntityPtr)0x0) && (xVar1 == '<')) &&
         (pxVar4->etype == XML_EXTERNAL_PARAMETER_ENTITY)) goto LAB_0013d75d;
LAB_0013d773:
      if (xVar1 == '%') {
LAB_0013d79a:
        xmlParsePEReference(ctxt);
      }
      else {
        if ((xVar1 != '<') || ((pxVar3[1] != '?' && (pxVar3[1] != '!')))) goto LAB_0013d7ec;
        xmlParseMarkupDecl(ctxt);
      }
    }
    xmlSkipBlankCharsPE(ctxt);
    if ((ctxt->input->flags & 0x40) == 0) {
      xmlParserShrink(ctxt);
    }
    pxVar5 = ctxt->input;
    if (((pxVar5->flags & 0x40) == 0) && ((long)pxVar5->end - (long)pxVar5->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    goto LAB_0013d70b;
  }
LAB_0013d827:
  if ((ctxt->wellFormed != 0) && (*ctxt->input->cur != '>')) {
    xmlFatalErr(ctxt,XML_ERR_DOCTYPE_NOT_FINISHED,(char *)0x0);
    return;
  }
  xmlNextChar(ctxt);
  return;
LAB_0013d7ec:
  xmlFatalErr(ctxt,XML_ERR_INT_SUBSET_NOT_FINISHED,(char *)0x0);
LAB_0013d805:
  while (iVar2 < ctxt->inputNr) {
    xmlPopPE(ctxt);
  }
  if (*ctxt->input->cur == ']') {
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
  }
  goto LAB_0013d827;
}

Assistant:

static void
xmlParseInternalSubset(xmlParserCtxtPtr ctxt) {
    /*
     * Is there any DTD definition ?
     */
    if (RAW == '[') {
        int oldInputNr = ctxt->inputNr;

        NEXT;
	/*
	 * Parse the succession of Markup declarations and
	 * PEReferences.
	 * Subsequence (markupdecl | PEReference | S)*
	 */
	SKIP_BLANKS;
	while (((RAW != ']') || (ctxt->inputNr > oldInputNr)) &&
               (PARSER_STOPPED(ctxt) == 0)) {

            /*
             * Conditional sections are allowed from external entities included
             * by PE References in the internal subset.
             */
            if ((PARSER_EXTERNAL(ctxt)) &&
                (RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
                xmlParseConditionalSections(ctxt);
            } else if ((RAW == '<') && ((NXT(1) == '!') || (NXT(1) == '?'))) {
	        xmlParseMarkupDecl(ctxt);
            } else if (RAW == '%') {
	        xmlParsePEReference(ctxt);
            } else {
		xmlFatalErr(ctxt, XML_ERR_INT_SUBSET_NOT_FINISHED, NULL);
                break;
            }
	    SKIP_BLANKS_PE;
            SHRINK;
            GROW;
	}

        while (ctxt->inputNr > oldInputNr)
            xmlPopPE(ctxt);

	if (RAW == ']') {
	    NEXT;
	    SKIP_BLANKS;
	}
    }

    /*
     * We should be at the end of the DOCTYPE declaration.
     */
    if ((ctxt->wellFormed) && (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED, NULL);
	return;
    }
    NEXT;
}